

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Maybe<kj::FsNode::Metadata> * __thiscall
kj::anon_unknown_9::DiskHandle::tryLstat
          (Maybe<kj::FsNode::Metadata> *__return_storage_ptr__,DiskHandle *this,PathPtr path)

{
  size_t sVar1;
  int iVar2;
  Type TVar3;
  char *pcVar4;
  Fault f;
  stat stats;
  String local_e8;
  PathPtr local_d0;
  stat64 local_c0;
  
  local_d0.parts.size_ = path.parts.size_;
  local_d0.parts.ptr = path.parts.ptr;
  while( true ) {
    iVar2 = (this->fd).fd;
    PathPtr::toString(&local_e8,&local_d0,false);
    pcVar4 = "";
    if (local_e8.content.size_ != 0) {
      pcVar4 = local_e8.content.ptr;
    }
    iVar2 = fstatat64(iVar2,pcVar4,&local_c0,0x100);
    sVar1 = local_e8.content.size_;
    pcVar4 = local_e8.content.ptr;
    if (local_e8.content.ptr != (char *)0x0) {
      local_e8.content.ptr = (char *)0x0;
      local_e8.content.size_ = 0;
      (**(local_e8.content.disposer)->_vptr_ArrayDisposer)
                (local_e8.content.disposer,pcVar4,1,sVar1,sVar1,0);
    }
    if (-1 < iVar2) break;
    iVar2 = _::Debug::getOsErrorNumber(false);
    if (iVar2 != -1) {
LAB_001f9d14:
      if (iVar2 == 0) {
        TVar3 = modeToType(local_c0.st_mode);
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.type = TVar3;
        (__return_storage_ptr__->ptr).field_1.value.size = local_c0.st_size;
        (__return_storage_ptr__->ptr).field_1.value.spaceUsed = local_c0.st_blocks << 9;
        (__return_storage_ptr__->ptr).field_1.value.lastModified.value.value =
             local_c0.st_mtim.tv_sec * 1000000000 + local_c0.st_mtim.tv_nsec;
        (__return_storage_ptr__->ptr).field_1.value.linkCount = (uint)local_c0.st_nlink;
        (__return_storage_ptr__->ptr).field_1.value.hashCode =
             (local_c0.st_dev << 0x20 | local_c0.st_dev >> 0x20) ^ local_c0.st_ino;
      }
      else if ((iVar2 == 0x14) || (iVar2 == 2)) {
        (__return_storage_ptr__->ptr).isSet = false;
      }
      else {
        _::Debug::Fault::Fault<int,kj::PathPtr&>
                  ((Fault *)&local_e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x2f5,iVar2,"faccessat(fd, path)","path",&local_d0);
        (__return_storage_ptr__->ptr).isSet = false;
        _::Debug::Fault::~Fault((Fault *)&local_e8);
      }
      return __return_storage_ptr__;
    }
  }
  iVar2 = 0;
  goto LAB_001f9d14;
}

Assistant:

Maybe<FsNode::Metadata> tryLstat(PathPtr path) const {
    struct stat stats;
    KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd, path.toString().cStr(), &stats, AT_SYMLINK_NOFOLLOW)) {
      case ENOENT:
      case ENOTDIR:
        return kj::none;
      default:
        KJ_FAIL_SYSCALL("faccessat(fd, path)", error, path) { return kj::none; }
    }
    return statToMetadata(stats);
  }